

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_closure_t * gravity_closure_new(gravity_vm *vm,gravity_function_t *f)

{
  uint16_t uVar1;
  gravity_object_t *obj;
  void *local_30;
  uint16_t nupvalues;
  gravity_closure_t *closure;
  gravity_function_t *f_local;
  gravity_vm *vm_local;
  
  obj = (gravity_object_t *)gravity_calloc((gravity_vm *)0x0,1,0x58);
  if (obj != (gravity_object_t *)0x0) {
    obj->isa = gravity_class_closure;
    obj->objclass = (gravity_class_t *)vm;
    obj->identifier = (char *)f;
    if (f == (gravity_function_t *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = f->nupvalues;
    }
    if (uVar1 == 0) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = gravity_calloc((gravity_vm *)0x0,1,(long)(int)(f->nupvalues + 1) << 3);
    }
    obj->xdata = local_30;
    if (vm != (gravity_vm *)0x0) {
      gravity_vm_transfer(vm,obj);
    }
    return (gravity_closure_t *)obj;
  }
  __assert_fail("closure",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                ,0x4ab,"gravity_closure_t *gravity_closure_new(gravity_vm *, gravity_function_t *)")
  ;
}

Assistant:

gravity_closure_t *gravity_closure_new (gravity_vm *vm, gravity_function_t *f) {
    gravity_closure_t *closure = (gravity_closure_t *)mem_alloc(NULL, sizeof(gravity_closure_t));
    assert(closure);

    closure->isa = gravity_class_closure;
    closure->vm = vm;
    closure->f = f;

    // allocate upvalue array (+1 so I can simplify the iterator without the needs to access closure->f->nupvalues)
    uint16_t nupvalues = (f) ? f->nupvalues : 0;
    closure->upvalue = (nupvalues) ? (gravity_upvalue_t **)mem_alloc(NULL, sizeof(gravity_upvalue_t*) * (f->nupvalues + 1)) : NULL;

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*)closure);
    return closure;
}